

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsSecondDeriv
          (BeagleCPUImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int secondDerivativeIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood,
          double *outSumFirstDerivative,double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  float **ppfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  int *piVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  double *pdVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  float *pfVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  float *pfVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  double dVar47;
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined8 in_XMM6_Qb;
  
  pfVar8 = this->gPartials[parIndex];
  ppfVar9 = this->gTransitionMatrices;
  pfVar10 = ppfVar9[probIndex];
  pfVar11 = ppfVar9[firstDerivativeIndex];
  pfVar12 = ppfVar9[secondDerivativeIndex];
  pfVar13 = this->gCategoryWeights[categoryWeightsIndex];
  pfVar14 = this->gStateFrequencies[stateFrequenciesIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->firstDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  memset(this->secondDerivTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
  if ((childIndex < this->kTipCount) &&
     (piVar15 = this->gTipStates[childIndex], piVar15 != (int *)0x0)) {
    iVar30 = this->kCategoryCount;
    if (0 < (long)iVar30) {
      uVar4 = this->kPatternCount;
      uVar5 = this->kStateCount;
      iVar6 = this->kMatrixSize;
      iVar7 = this->kPartialsPaddedStateCount;
      lVar23 = 0;
      iVar20 = 0;
      lVar25 = 0;
      do {
        if (0 < (int)uVar4) {
          fVar38 = pfVar13[lVar23];
          pfVar24 = this->integrationTmp;
          pfVar16 = this->firstDerivTmp;
          pfVar17 = this->secondDerivTmp;
          iVar21 = this->kTransPaddedStateCount;
          lVar25 = (long)(int)lVar25;
          pfVar28 = pfVar8 + lVar25;
          uVar22 = 0;
          iVar29 = 0;
          do {
            if (0 < (int)uVar5) {
              lVar31 = (long)piVar15[uVar22] + (long)iVar20;
              uVar26 = 0;
              do {
                auVar33 = vfmadd213ss_fma(ZEXT416((uint)(pfVar10[lVar31] * pfVar28[uVar26])),
                                          ZEXT416((uint)fVar38),
                                          ZEXT416((uint)pfVar24[(long)iVar29 + uVar26]));
                pfVar24[(long)iVar29 + uVar26] = auVar33._0_4_;
                auVar33 = vfmadd213ss_fma(ZEXT416((uint)(pfVar11[lVar31] * pfVar28[uVar26])),
                                          ZEXT416((uint)fVar38),
                                          ZEXT416((uint)pfVar16[(long)iVar29 + uVar26]));
                pfVar16[(long)iVar29 + uVar26] = auVar33._0_4_;
                auVar33 = vfmadd213ss_fma(ZEXT416((uint)(pfVar12[lVar31] * pfVar28[uVar26])),
                                          ZEXT416((uint)fVar38),
                                          ZEXT416((uint)pfVar17[(long)iVar29 + uVar26]));
                pfVar17[(long)iVar29 + uVar26] = auVar33._0_4_;
                uVar26 = uVar26 + 1;
                lVar31 = lVar31 + iVar21;
              } while (uVar5 != uVar26);
              iVar29 = iVar29 + (int)uVar26;
            }
            lVar25 = lVar25 + iVar7;
            uVar22 = uVar22 + 1;
            pfVar28 = pfVar28 + iVar7;
          } while (uVar22 != uVar4);
        }
        lVar23 = lVar23 + 1;
        iVar20 = iVar20 + iVar6;
      } while (lVar23 != iVar30);
    }
  }
  else {
    iVar30 = this->kCategoryCount;
    if (0 < (long)iVar30) {
      pfVar28 = this->gPartials[childIndex];
      iVar6 = this->kPatternCount;
      uVar4 = this->kStateCount;
      iVar7 = this->kMatrixSize;
      iVar20 = this->kPartialsPaddedStateCount;
      iVar21 = 0;
      lVar23 = 0;
      lVar25 = 0;
      do {
        if (0 < iVar6) {
          auVar33._0_8_ = (double)pfVar13[lVar23];
          auVar33._8_8_ = in_XMM6_Qb;
          pfVar16 = this->integrationTmp;
          pfVar17 = this->firstDerivTmp;
          pfVar18 = this->secondDerivTmp;
          lVar25 = (long)(int)lVar25;
          pfVar24 = pfVar28 + lVar25;
          iVar29 = 0;
          lVar31 = 0;
          do {
            if (0 < (int)uVar4) {
              lVar31 = (long)(int)lVar31;
              uVar22 = 0;
              iVar27 = iVar21;
              do {
                dVar39 = 0.0;
                uVar26 = 0;
                dVar47 = 0.0;
                dVar32 = 0.0;
                do {
                  fVar38 = pfVar24[uVar26];
                  dVar32 = dVar32 + (double)(fVar38 * pfVar10[(long)iVar27 + uVar26]);
                  dVar47 = dVar47 + (double)(fVar38 * pfVar11[(long)iVar27 + uVar26]);
                  dVar39 = dVar39 + (double)(fVar38 * pfVar12[(long)iVar27 + uVar26]);
                  uVar26 = uVar26 + 1;
                } while (uVar4 != uVar26);
                auVar52._0_8_ = (double)pfVar16[lVar31];
                auVar52._8_8_ = in_XMM6_Qb;
                auVar50._8_8_ = 0;
                auVar50._0_8_ = dVar32 * (double)pfVar8[lVar25 + uVar22];
                auVar40 = vfmadd231sd_fma(auVar52,auVar33,auVar50);
                pfVar16[lVar31] = (float)auVar40._0_8_;
                auVar51._0_8_ = (double)pfVar17[lVar31];
                auVar51._8_8_ = in_XMM6_Qb;
                auVar41._8_8_ = 0;
                auVar41._0_8_ = dVar47 * (double)pfVar8[lVar25 + uVar22];
                auVar40 = vfmadd231sd_fma(auVar51,auVar33,auVar41);
                pfVar17[lVar31] = (float)auVar40._0_8_;
                auVar48._0_8_ = (double)pfVar18[lVar31];
                auVar48._8_8_ = in_XMM6_Qb;
                auVar40._8_8_ = 0;
                auVar40._0_8_ = dVar39 * (double)pfVar8[lVar25 + uVar22];
                auVar40 = vfmadd231sd_fma(auVar48,auVar33,auVar40);
                pfVar18[lVar31] = (float)auVar40._0_8_;
                lVar31 = lVar31 + 1;
                uVar22 = uVar22 + 1;
                iVar27 = iVar27 + uVar4 + 1;
              } while (uVar22 != uVar4);
            }
            lVar25 = lVar25 + iVar20;
            iVar29 = iVar29 + 1;
            pfVar24 = pfVar24 + iVar20;
          } while (iVar29 != iVar6);
        }
        lVar23 = lVar23 + 1;
        iVar21 = iVar21 + iVar7;
      } while (lVar23 != iVar30);
    }
  }
  uVar22 = (ulong)(uint)this->kPatternCount;
  if (0 < this->kPatternCount) {
    lVar23 = 0;
    iVar30 = 0;
    do {
      iVar6 = this->kStateCount;
      if ((long)iVar6 < 1) {
        auVar33 = ZEXT816(0);
        fVar49 = 0.0;
        fVar38 = 0.0;
      }
      else {
        auVar41 = ZEXT816(0) << 0x40;
        lVar25 = 0;
        auVar40 = ZEXT816(0) << 0x40;
        auVar33 = ZEXT816(0);
        do {
          fVar38 = pfVar14[lVar25];
          auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar38),
                                    ZEXT416((uint)this->integrationTmp[iVar30 + lVar25]));
          auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar38),
                                    ZEXT416((uint)this->firstDerivTmp[iVar30 + lVar25]));
          auVar41 = vfmadd231ss_fma(auVar41,ZEXT416((uint)fVar38),
                                    ZEXT416((uint)this->secondDerivTmp[iVar30 + lVar25]));
          lVar25 = lVar25 + 1;
        } while (iVar6 != lVar25);
        iVar30 = iVar30 + iVar6;
        fVar38 = auVar41._0_4_;
        fVar49 = auVar40._0_4_;
      }
      fVar46 = auVar33._0_4_;
      dVar32 = log((double)fVar46);
      this->outLogLikelihoodsTmp[lVar23] = (float)dVar32;
      auVar34._0_4_ = fVar49 / fVar46;
      auVar34._4_12_ = SUB6012((undefined1  [60])0x0,0);
      this->outFirstDerivativesTmp[lVar23] = auVar34._0_4_;
      auVar42._0_4_ = fVar38 / fVar46;
      auVar42._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar33 = vfnmadd231ss_fma(auVar42,auVar34,auVar34);
      this->outSecondDerivativesTmp[lVar23] = auVar33._0_4_;
      lVar23 = lVar23 + 1;
      uVar22 = (ulong)this->kPatternCount;
    } while (lVar23 < (long)uVar22);
  }
  if ((scalingFactorsIndex != -1) && (0 < (int)uVar22)) {
    pfVar8 = this->gScaleBuffers[scalingFactorsIndex];
    pfVar10 = this->outLogLikelihoodsTmp;
    uVar26 = 0;
    do {
      pfVar10[uVar26] = pfVar8[uVar26] + pfVar10[uVar26];
      uVar26 = uVar26 + 1;
    } while ((uVar22 & 0xffffffff) != uVar26);
  }
  *outSumLogLikelihood = 0.0;
  *outSumFirstDerivative = 0.0;
  *outSumSecondDerivative = 0.0;
  if (0 < (int)uVar22) {
    pdVar19 = this->gPatternWeights;
    pfVar8 = this->outLogLikelihoodsTmp;
    pfVar10 = this->outFirstDerivativesTmp;
    pfVar11 = this->outSecondDerivativesTmp;
    uVar26 = 0;
    do {
      auVar35._0_8_ = (double)pfVar8[uVar26];
      auVar35._8_8_ = in_XMM6_Qb;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = pdVar19[uVar26];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *outSumLogLikelihood;
      auVar33 = vfmadd213sd_fma(auVar43,auVar35,auVar1);
      *outSumLogLikelihood = auVar33._0_8_;
      auVar36._0_8_ = (double)pfVar10[uVar26];
      auVar36._8_8_ = in_XMM6_Qb;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = pdVar19[uVar26];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *outSumFirstDerivative;
      auVar33 = vfmadd213sd_fma(auVar44,auVar36,auVar2);
      *outSumFirstDerivative = auVar33._0_8_;
      auVar37._0_8_ = (double)pfVar11[uVar26];
      auVar37._8_8_ = in_XMM6_Qb;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = pdVar19[uVar26];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *outSumSecondDerivative;
      auVar33 = vfmadd213sd_fma(auVar45,auVar37,auVar3);
      *outSumSecondDerivative = auVar33._0_8_;
      uVar26 = uVar26 + 1;
    } while ((uVar22 & 0xffffffff) != uVar26);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDeriv(const int parIndex,
                                                                         const int childIndex,
                                                                         const int probIndex,
                                                                         const int firstDerivativeIndex,
                                                                         const int secondDerivativeIndex,
                                                                         const int categoryWeightsIndex,
                                                                         const int stateFrequenciesIndex,
                                                                         const int scalingFactorsIndex,
                                                                         double* outSumLogLikelihood,
                                                                         double* outSumFirstDerivative,
                                                                         double* outSumSecondDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(secondDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    double sumOverJD2 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        REALTYPE sumOverID2 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            sumOverID2 += freqs[i] * secondDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
        outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    *outSumSecondDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];

        *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}